

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O2

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
::replace_neighbour(quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
                    *this,size_type f,size_type _from,size_type _to)

{
  reference pfVar1;
  pointer puVar2;
  
  if (_from != _to) {
    pfVar1 = std::
             _Deque_iterator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_&,_quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet_*>
             ::operator[](&(this->facets_).
                           super__Deque_base<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet,_std::allocator<quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>::facet>_>
                           ._M_impl.super__Deque_impl_data._M_start,f);
    for (puVar2 = (pfVar1->neighbours_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start;
        puVar2 != (pfVar1->neighbours_).
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_finish; puVar2 = puVar2 + 1) {
      if (*puVar2 == _from) {
        *puVar2 = _to;
        return;
      }
    }
  }
  return;
}

Assistant:

void
    replace_neighbour(size_type const f,
                      size_type const _from,
                      size_type const _to)
    {
        if (_from != _to) {
            for (size_type & n : facets_[f].neighbours_) {
                if (n == _from) {
                    n = _to;
                    return;
                }
            }
        }
    }